

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O2

unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> __thiscall
duckdb::RenderTree::CreateRenderTree(RenderTree *this,Pipeline *pipeline)

{
  __uniq_ptr_impl<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_> __p;
  pointer __p_00;
  pointer pPVar1;
  type op;
  type result;
  pointer prVar2;
  unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>,_true> node
  ;
  templated_unique_single_t new_node;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> operators;
  __uniq_ptr_impl<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
  local_58;
  pointer local_50;
  idx_t local_48;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> local_40;
  
  Pipeline::GetOperators(&local_40,pipeline);
  local_58._M_t.
  super__Tuple_impl<0UL,_duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>
  .super__Head_base<0UL,_duckdb::PipelineRenderNode_*,_false>._M_head_impl =
       (tuple<duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>)
       (_Tuple_impl<0UL,_duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>
        )0x0;
  for (prVar2 = local_40.
                super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      prVar2 != local_40.
                super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; prVar2 = prVar2 + 1) {
    make_uniq<duckdb::PipelineRenderNode,duckdb::PhysicalOperator_const&>
              ((duckdb *)&local_50,prVar2->_M_data);
    pPVar1 = unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>,_true>
             ::operator->((unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>,_true>
                           *)&local_50);
    __p._M_t.
    super__Tuple_impl<0UL,_duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>
    .super__Head_base<0UL,_duckdb::PipelineRenderNode_*,_false>._M_head_impl =
         local_58._M_t.
         super__Tuple_impl<0UL,_duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>
         .super__Head_base<0UL,_duckdb::PipelineRenderNode_*,_false>._M_head_impl;
    local_58._M_t.
    super__Tuple_impl<0UL,_duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>
    .super__Head_base<0UL,_duckdb::PipelineRenderNode_*,_false>._M_head_impl =
         (tuple<duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>)
         (_Tuple_impl<0UL,_duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>
          )0x0;
    std::
    __uniq_ptr_impl<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>::
    reset((__uniq_ptr_impl<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
           *)&pPVar1->child,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>
                   .super__Head_base<0UL,_duckdb::PipelineRenderNode_*,_false>._M_head_impl);
    __p_00 = local_50;
    local_50 = (pointer)0x0;
    std::
    __uniq_ptr_impl<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>::
    reset(&local_58,__p_00);
    std::unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>::
    ~unique_ptr((unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
                 *)&local_50);
  }
  op = unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>,_true>
       ::operator*((unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>,_true>
                    *)&local_58);
  GetTreeWidthHeight<duckdb::PipelineRenderNode>(op,(idx_t *)&local_50,&local_48);
  make_uniq<duckdb::RenderTree,unsigned_long&,unsigned_long&>
            ((duckdb *)this,(unsigned_long *)&local_50,&local_48);
  result = unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::operator*
                     ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>
                       *)this);
  CreateTreeRecursive<duckdb::PipelineRenderNode>(result,op,0,0);
  std::unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>::
  ~unique_ptr((unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
               *)&local_58);
  std::
  _Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                   *)&local_40);
  return (unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>_>)
         (unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>_>)this;
}

Assistant:

unique_ptr<RenderTree> RenderTree::CreateRenderTree(const Pipeline &pipeline) {
	auto operators = pipeline.GetOperators();
	D_ASSERT(!operators.empty());
	unique_ptr<PipelineRenderNode> node;
	for (auto &op : operators) {
		auto new_node = make_uniq<PipelineRenderNode>(op.get());
		new_node->child = std::move(node);
		node = std::move(new_node);
	}
	return CreateTree<PipelineRenderNode>(*node);
}